

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

char * al_get_path_component(ALLEGRO_PATH *path,int i)

{
  size_t sVar1;
  char *pcVar2;
  int in_ESI;
  long in_RDI;
  uint in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI < 0) {
    sVar1 = _al_vector_size((_AL_VECTOR *)(in_RDI + 0x10));
    in_ESI = (int)sVar1 + in_ESI;
  }
  pcVar2 = get_segment_cstr((ALLEGRO_PATH *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                            in_stack_ffffffffffffffec);
  return pcVar2;
}

Assistant:

const char *al_get_path_component(const ALLEGRO_PATH *path, int i)
{
   ASSERT(path);
   ASSERT(i < (int)_al_vector_size(&path->segments));

   if (i < 0)
      i = _al_vector_size(&path->segments) + i;

   ASSERT(i >= 0);

   return get_segment_cstr(path, i);
}